

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_Annotation::Transform(ON_OBSOLETE_V5_Annotation *this,ON_Xform *xform)

{
  double d0;
  double dVar1;
  bool bVar2;
  int i;
  int idx;
  ON_2dPoint OVar3;
  ON_3dVector vy;
  ON_3dVector vx;
  ON_Xform xfscale;
  ON_2dPoint local_f8;
  ON_3dVector local_e8;
  ON_3dVector local_c8;
  ON_Xform local_a8;
  
  ON_Geometry::Transform(&this->super_ON_Geometry,xform);
  local_c8.z = (this->m_plane).xaxis.z;
  local_c8.x = (this->m_plane).xaxis.x;
  local_c8.y = (this->m_plane).xaxis.y;
  local_e8.z = (this->m_plane).yaxis.z;
  local_e8.x = (this->m_plane).yaxis.x;
  local_e8.y = (this->m_plane).yaxis.y;
  ON_3dVector::Transform(&local_c8,xform);
  ON_3dVector::Transform(&local_e8,xform);
  d0 = ON_3dVector::Length(&local_c8);
  dVar1 = ON_3dVector::Length(&local_e8);
  if (((0.0001 < ABS(d0)) && (0.0001 < ABS(d0 + -1.0))) ||
     ((0.0001 < ABS(dVar1) && (0.0001 < ABS(dVar1 + -1.0))))) {
    ON_Xform::DiagonalTransformation(&local_a8,d0,dVar1,1.0);
    for (idx = 0; idx < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count; idx = idx + 1) {
      OVar3 = Point(this,idx);
      local_f8.y = OVar3.y;
      local_f8.x = OVar3.x;
      ON_2dPoint::Transform(&local_f8,&local_a8);
      SetPoint(this,idx,&local_f8);
    }
  }
  if ((this->m_type == dtTextBlock) &&
     (dVar1 = this->m_textheight * dVar1, 1.490116119385e-08 < dVar1)) {
    this->m_textheight = dVar1;
  }
  bVar2 = ON_Plane::Transform(&this->m_plane,xform);
  return bVar2;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::Transform( const ON_Xform& xform )
{
  ON_Geometry::Transform(xform);
  const double tol = 1.0e-4;
  ON_3dVector vx = Plane().xaxis;
  ON_3dVector vy = Plane().yaxis;
  vx.Transform(xform);
  vy.Transform(xform);
  double sx = vx.Length();
  double sy = vy.Length();
  if ((fabs(sx - 1.0) > tol && fabs(sx) > tol) ||
      (fabs(sy - 1.0) > tol && fabs(sy) > tol))
  {
    ON_Xform xfscale(ON_Xform::DiagonalTransformation(sx, sy, 1.0));

    ON_2dPoint p;
    for (int i = 0; i < m_points.Count(); i++)
    {
      p = Point(i);
      p.Transform(xfscale);
      SetPoint(i, p);
    }
  }
  // This scales the text height on text but not on dimensions
  if (ON_OBSOLETE_V5_Annotation::IsText())
  {
    SetHeight(sy * Height());
  }

  return m_plane.Transform(xform);
}